

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QLayoutItem * __thiscall QDockAreaLayoutInfo::unplug(QDockAreaLayoutInfo *this,QList<int> *path)

{
  ulong uVar1;
  QDockAreaLayoutInfo *this_00;
  int *piVar2;
  long lVar3;
  Data *pDVar4;
  bool bVar5;
  CutResult CVar6;
  pointer pQVar7;
  QLayoutItem *pQVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype p;
  QList<int> local_68;
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (path->d).size;
  uVar12 = *(path->d).ptr;
  pQVar7 = QList<QDockAreaLayoutItem>::data(&this->item_list);
  lVar10 = (long)(int)uVar12;
  if (uVar1 < 2) {
    pQVar7 = pQVar7 + lVar10;
    uVar9 = uVar12;
    uVar11 = uVar12;
    do {
      uVar11 = uVar11 - 1;
      if ((int)uVar9 < 1) {
        uVar9 = 0xffffffff;
        break;
      }
      bVar5 = QDockAreaLayoutItem::skip((this->item_list).d.ptr + uVar11);
      uVar9 = uVar9 - 1;
    } while (bVar5);
    lVar3 = lVar10 * 0x28;
    do {
      lVar10 = lVar10 + 1;
      if ((this->item_list).d.size <= lVar10) {
        uVar12 = 0xffffffff;
        break;
      }
      bVar5 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->item_list).d.ptr[1].widgetItem + lVar3));
      uVar12 = uVar12 + 1;
      lVar3 = lVar3 + 0x28;
    } while (bVar5);
    *(byte *)&pQVar7->flags = (byte)pQVar7->flags | 1;
    if (this->tabbed == false) {
      if ((uVar9 != 0xffffffff) && (((this->item_list).d.ptr[(int)uVar9].flags & 1) == 0)) {
        piVar2 = this->sep;
        pQVar7->pos = pQVar7->pos - *piVar2;
        pQVar7->size = pQVar7->size + *piVar2;
      }
      if ((uVar12 != 0xffffffff) && (((this->item_list).d.ptr[(int)uVar12].flags & 1) == 0)) {
        pQVar7->size = pQVar7->size + *this->sep;
      }
    }
    pQVar8 = pQVar7->widgetItem;
  }
  else {
    this_00 = pQVar7[lVar10].subinfo;
    local_40 = 1;
    local_48 = -1;
    CVar6 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_40,&local_48);
    if (CVar6 < Full) {
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (int *)0x0;
      local_68.d.size = 0;
      pQVar8 = unplug(this_00,&local_68);
    }
    else {
      if (CVar6 == Full) {
        local_68.d.d = (path->d).d;
        local_68.d.ptr = (path->d).ptr;
        local_68.d.size = (path->d).size;
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.d.ptr =
             (int *)QArrayData::allocate((QArrayData **)&local_68,4,0x10,local_48,KeepSize);
        local_68.d.size = local_48;
        pDVar4 = local_68.d.d;
        if (local_48 != 0) {
          memcpy(local_68.d.ptr,(path->d).ptr + local_40,local_48 * 4);
        }
        local_68.d.d = pDVar4;
        if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar4->super_QArrayData,4,0x10);
          }
        }
      }
      pDVar4 = local_68.d.d;
      pQVar8 = unplug(this_00,&local_68);
      if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar8;
}

Assistant:

QLayoutItem *QDockAreaLayoutInfo::unplug(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());

    const int index = path.first();
    if (path.size() > 1) {
        QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->unplug(path.mid(1));
    }

    QDockAreaLayoutItem &item = item_list[index];
    int prev = this->prev(index);
    int next = this->next(index);

    Q_ASSERT(!(item.flags & QDockAreaLayoutItem::GapItem));
    item.flags |= QDockAreaLayoutItem::GapItem;

#if QT_CONFIG(tabbar)
    if (tabbed) {
    } else
#endif
    {
        if (prev != -1 && !(item_list.at(prev).flags & QDockAreaLayoutItem::GapItem)) {
            item.pos -= *sep;
            item.size += *sep;
        }
        if (next != -1 && !(item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
            item.size += *sep;
    }

    return item.widgetItem;
}